

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O0

void __thiscall
base_iterator_matrix_sparse_element_test_increment_and_decrement_Test::
~base_iterator_matrix_sparse_element_test_increment_and_decrement_Test
          (base_iterator_matrix_sparse_element_test_increment_and_decrement_Test *this)

{
  base_iterator_matrix_sparse_element_test_increment_and_decrement_Test *this_local;
  
  ~base_iterator_matrix_sparse_element_test_increment_and_decrement_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(base_iterator_matrix_sparse_element_test, increment_and_decrement) {
  Base_Iterator_Matrix_Sparse_Element<double, int, false> iter(&columns[0], &entries[0]);
  ++iter;
  EXPECT_EQ((*iter).i_column(), 1);
  EXPECT_EQ((*iter).value(), 2.0);

  iter++;
  EXPECT_EQ((*iter).i_column(), 2);
  EXPECT_EQ((*iter).value(), 3.0);

  --iter;
  EXPECT_EQ((*iter).i_column(), 1);
  EXPECT_EQ((*iter).value(), 2.0);

  iter--;
  EXPECT_EQ((*iter).i_column(), 0);
  EXPECT_EQ((*iter).value(), 1.0);
}